

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void WriteCompactSize<ParamsStream<SizeComputer&,TransactionSerParams>>
               (ParamsStream<SizeComputer_&,_TransactionSerParams> *os,uint64_t nSize)

{
  long lVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (nSize < 0xfd) {
    os->m_substream->nSize = os->m_substream->nSize + 1;
  }
  else if (nSize < 0x10000) {
    os->m_substream->nSize = os->m_substream->nSize + 3;
  }
  else {
    sVar2 = os->m_substream->nSize;
    if (nSize >> 0x20 == 0) {
      sVar2 = sVar2 + 5;
    }
    else {
      sVar2 = sVar2 + 9;
    }
    os->m_substream->nSize = sVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteCompactSize(Stream& os, uint64_t nSize)
{
    if (nSize < 253)
    {
        ser_writedata8(os, nSize);
    }
    else if (nSize <= std::numeric_limits<uint16_t>::max())
    {
        ser_writedata8(os, 253);
        ser_writedata16(os, nSize);
    }
    else if (nSize <= std::numeric_limits<unsigned int>::max())
    {
        ser_writedata8(os, 254);
        ser_writedata32(os, nSize);
    }
    else
    {
        ser_writedata8(os, 255);
        ser_writedata64(os, nSize);
    }
    return;
}